

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationData::getScriptIndex(CollationData *this,int32_t script)

{
  int32_t script_local;
  CollationData *this_local;
  
  if (script < 0) {
    this_local._4_4_ = 0;
  }
  else if (script < this->numScripts) {
    this_local._4_4_ = (uint)this->scriptsIndex[script];
  }
  else if (script < 0x1000) {
    this_local._4_4_ = 0;
  }
  else if (script + -0x1000 < 8) {
    this_local._4_4_ = (uint)this->scriptsIndex[this->numScripts + script + -0x1000];
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationData::getScriptIndex(int32_t script) const {
    if(script < 0) {
        return 0;
    } else if(script < numScripts) {
        return scriptsIndex[script];
    } else if(script < UCOL_REORDER_CODE_FIRST) {
        return 0;
    } else {
        script -= UCOL_REORDER_CODE_FIRST;
        if(script < MAX_NUM_SPECIAL_REORDER_CODES) {
            return scriptsIndex[numScripts + script];
        } else {
            return 0;
        }
    }
}